

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCompressedTexture.cpp
# Opt level: O2

void tcu::anon_unknown_0::decompressEAC_RG11(PixelBufferAccess *dst,deUint8 *src,bool signedMode)

{
  int iVar1;
  void *pvVar2;
  deInt16 dVar3;
  ushort uVar4;
  deUint64 src_00;
  deUint64 src_01;
  int x;
  int iVar5;
  long lVar6;
  int y;
  long lVar7;
  deUint8 *dst_00;
  deUint8 *dst_01;
  deUint8 uncompressedBlockG [32];
  deUint8 uncompressedBlockR [32];
  
  pvVar2 = (dst->super_ConstPixelBufferAccess).m_data;
  iVar1 = (dst->super_ConstPixelBufferAccess).m_pitch.m_data[1];
  iVar5 = 0;
  src_00 = EtcDecompressInternal::get64BitBlock(src,0);
  src_01 = EtcDecompressInternal::get64BitBlock(src,1);
  dst_00 = uncompressedBlockR;
  EtcDecompressInternal::decompressEAC11Block(dst_00,src_00,signedMode);
  dst_01 = uncompressedBlockG;
  EtcDecompressInternal::decompressEAC11Block(dst_01,src_01,signedMode);
  for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
    for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
      uVar4 = *(ushort *)(dst_00 + lVar6 * 2);
      if (signedMode) {
        dVar3 = EtcDecompressInternal::extend11To16WithSign(uVar4);
        *(deInt16 *)((long)pvVar2 + lVar6 * 4 + (long)iVar5) = dVar3;
        uVar4 = EtcDecompressInternal::extend11To16WithSign(*(deInt16 *)(dst_01 + lVar6 * 2));
      }
      else {
        *(ushort *)((long)pvVar2 + lVar6 * 4 + (long)iVar5) = uVar4 >> 6 | uVar4 << 5;
        uVar4 = *(ushort *)(dst_01 + lVar6 * 2) >> 6 | *(ushort *)(dst_01 + lVar6 * 2) << 5;
      }
      *(ushort *)((long)pvVar2 + lVar6 * 4 + (long)iVar5 + 2) = uVar4;
    }
    iVar5 = iVar5 + iVar1;
    dst_01 = dst_01 + 8;
    dst_00 = dst_00 + 8;
  }
  return;
}

Assistant:

void decompressEAC_RG11 (const PixelBufferAccess& dst, const deUint8* src, bool signedMode)
{
	using namespace EtcDecompressInternal;

	deUint8* const	dstPtr			= (deUint8*)dst.getDataPtr();
	const int		dstRowPitch		= dst.getRowPitch();
	const int		dstPixelSize	= ETC2_UNCOMPRESSED_PIXEL_SIZE_RG11;

	const deUint64	compressedBlockR = get128BitBlockStart(src, 0);
	const deUint64	compressedBlockG = get128BitBlockEnd(src, 0);
	deUint8			uncompressedBlockR[ETC2_UNCOMPRESSED_BLOCK_SIZE_R11];
	deUint8			uncompressedBlockG[ETC2_UNCOMPRESSED_BLOCK_SIZE_R11];

	// Decompress.
	decompressEAC11Block(uncompressedBlockR, compressedBlockR, signedMode);
	decompressEAC11Block(uncompressedBlockG, compressedBlockG, signedMode);

	// Write to dst.
	for (int y = 0; y < (int)ETC2_BLOCK_HEIGHT; y++)
	{
		for (int x = 0; x < (int)ETC2_BLOCK_WIDTH; x++)
		{
			DE_STATIC_ASSERT(ETC2_UNCOMPRESSED_PIXEL_SIZE_RG11 == 4);

			if (signedMode)
			{
				const deInt16* const	srcPixelR	= (deInt16*)&uncompressedBlockR[(y*ETC2_BLOCK_WIDTH + x)*ETC2_UNCOMPRESSED_PIXEL_SIZE_R11];
				const deInt16* const	srcPixelG	= (deInt16*)&uncompressedBlockG[(y*ETC2_BLOCK_WIDTH + x)*ETC2_UNCOMPRESSED_PIXEL_SIZE_R11];
				deInt16* const			dstPixel	= (deInt16*)(dstPtr + y*dstRowPitch + x*dstPixelSize);

				dstPixel[0] = extend11To16WithSign(srcPixelR[0]);
				dstPixel[1] = extend11To16WithSign(srcPixelG[0]);
			}
			else
			{
				const deUint16* const	srcPixelR	= (deUint16*)&uncompressedBlockR[(y*ETC2_BLOCK_WIDTH + x)*ETC2_UNCOMPRESSED_PIXEL_SIZE_R11];
				const deUint16* const	srcPixelG	= (deUint16*)&uncompressedBlockG[(y*ETC2_BLOCK_WIDTH + x)*ETC2_UNCOMPRESSED_PIXEL_SIZE_R11];
				deUint16* const			dstPixel	= (deUint16*)(dstPtr + y*dstRowPitch + x*dstPixelSize);

				dstPixel[0] = extend11To16(srcPixelR[0]);
				dstPixel[1] = extend11To16(srcPixelG[0]);
			}
		}
	}
}